

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImGuiListClipperData>::resize
          (ImVector<ImGuiListClipperData> *this,int new_size,ImGuiListClipperData *v)

{
  int new_capacity;
  int local_24;
  int n;
  ImGuiListClipperData *v_local;
  int new_size_local;
  ImVector<ImGuiListClipperData> *this_local;
  
  if (this->Capacity < new_size) {
    new_capacity = _grow_capacity(this,new_size);
    reserve(this,new_capacity);
  }
  if (this->Size < new_size) {
    for (local_24 = this->Size; local_24 < new_size; local_24 = local_24 + 1) {
      memcpy(this->Data + local_24,v,0x28);
    }
  }
  this->Size = new_size;
  return;
}

Assistant:

inline void         resize(int new_size, const T& v)    { if (new_size > Capacity) reserve(_grow_capacity(new_size)); if (new_size > Size) for (int n = Size; n < new_size; n++) memcpy(&Data[n], &v, sizeof(v)); Size = new_size; }